

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake.cpp
# Opt level: O3

QString * __thiscall
UnixMakefileGenerator::defaultInstall
          (QString *__return_storage_ptr__,UnixMakefileGenerator *this,QString *t)

{
  QMakeProject *pQVar1;
  QString string;
  QString string_00;
  QString string_01;
  QString string_02;
  QString file_00;
  int *piVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ProString *pPVar7;
  Data *pDVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  bool bVar11;
  char cVar12;
  byte bVar13;
  char cVar14;
  bool bVar15;
  int iVar16;
  QList<ProString> *this_00;
  ProStringList *pPVar17;
  ProStringList *pPVar18;
  qsizetype qVar19;
  QList<ProString> *pQVar20;
  iterator this_01;
  iterator iVar21;
  pointer pPVar22;
  ProString *pPVar23;
  char *str;
  long lVar24;
  QString *pQVar25;
  int i;
  ulong uVar26;
  ulong uVar27;
  UnixMakefileGenerator *pUVar28;
  long in_FS_OFFSET;
  QStringView QVar29;
  QStringView QVar30;
  QByteArrayView QVar31;
  QAnyStringView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  QByteArrayView QVar48;
  QByteArrayView QVar49;
  QStringView config;
  QStringView config_00;
  QStringView config_01;
  QStringView config_02;
  QStringView config_03;
  QStringView config_04;
  QStringView config_05;
  QStringView config_06;
  QStringView config_07;
  QStringView config_08;
  QStringView config_09;
  QStringView config_10;
  QStringView config_11;
  QStringView config_12;
  QStringView QVar50;
  QStringView QVar51;
  ProString file;
  undefined7 in_stack_fffffffffffffd08;
  UnixMakefileGenerator *pUVar52;
  ProString local_2a8;
  undefined1 local_278 [16];
  ProString *local_268;
  undefined1 local_238 [16];
  ProString *local_228;
  ProString *local_220;
  char (*local_218) [17];
  QMakeLocalFileName *local_200;
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  undefined1 *local_1b8;
  undefined1 *puStack_1b0;
  QString local_1a8;
  undefined1 local_188 [32];
  undefined1 local_168 [32];
  undefined1 local_148 [32];
  undefined1 local_128 [32];
  QArrayDataPointer<ProString> local_108;
  undefined1 local_e8 [32];
  undefined1 local_c8 [36];
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 *local_98;
  undefined1 local_88 [12];
  undefined4 uStack_7c;
  ProString *local_78;
  undefined8 local_70;
  QString *local_68;
  QMakeLocalFileName *local_60;
  QString *local_58;
  QMakeLocalFileName *local_50;
  ProString *local_48;
  char *local_38;
  
  local_38 = *(char **)(in_FS_OFFSET + 0x28);
  bVar11 = comparesEqual(t,"target");
  if (bVar11) {
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)local_238,"TEMPLATE");
    QMakeEvaluator::first((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_238);
    bVar11 = ProString::operator==((ProString *)local_88,"subdirs");
    if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)local_88._0_8_)->d).d = *(int *)&(((QString *)local_88._0_8_)->d).d + -1
      ;
      UNLOCK();
      if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
      }
    }
    if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)local_238._0_8_)->d).d =
           *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
      }
    }
    if (!bVar11) {
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)local_238,"TEMPLATE");
      QMakeEvaluator::first((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_238)
      ;
      cVar12 = ProString::operator==((ProString *)local_88,"aux");
      if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_88._0_8_)->d).d =
             *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_238._0_8_)->d).d =
             *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
        }
      }
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._32_4_ = -0x55555556;
      uStack_a4 = 0xaaaaaaaa;
      uStack_a0 = 0xaaaaaaaa;
      uStack_9c = 0xaaaaaaaa;
      pUVar52 = this;
      (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x13])
                (local_c8 + 0x20,this);
      pQVar1 = (this->super_MakefileGenerator).project;
      local_238._8_8_ = ".uninstall";
      local_238._0_8_ = t;
      ProString::ProString<QString_const&,char_const(&)[11]>
                ((ProString *)local_88,
                 (QStringBuilder<const_QString_&,_const_char_(&)[11]> *)local_238);
      this_00 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_88)->
                 super_QList<ProString>;
      if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_88._0_8_)->d).d =
             *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      local_c8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)local_238,"DESTDIR");
      QMakeEvaluator::first((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_238)
      ;
      ProString::toQString((QString *)local_c8,(ProString *)local_88);
      pQVar25 = __return_storage_ptr__;
      if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_88._0_8_)->d).d =
             *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          pQVar25 = __return_storage_ptr__;
        }
      }
      if ((QArrayData *)local_238._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
        }
      }
      if ((undefined1 *)local_c8._16_8_ != (undefined1 *)0x0) {
        if ((undefined1 *)local_c8._16_8_ == (undefined1 *)0x1) {
          local_88._0_8_ = local_c8._0_8_;
          stack0xffffffffffffff80 = (ProString *)local_c8._8_8_;
          local_78 = (ProString *)0x1;
          if ((ProString *)local_c8._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_c8._0_8_)->d).d =
                 *(int *)&(((QString *)local_c8._0_8_)->d).d + 1;
            UNLOCK();
          }
        }
        else {
          QString::QString((QString *)local_88,(QChar *)(local_c8._8_8_ + local_c8._16_8_ * 2 + -2),
                           1);
        }
        bVar13 = 1;
        if (local_78 == (ProString *)Option::dir_sep.d.size) {
          QVar29.m_data = (storage_type_conflict *)stack0xffffffffffffff80;
          QVar29.m_size = (qsizetype)local_78;
          QVar50.m_data = Option::dir_sep.d.ptr;
          QVar50.m_size = (qsizetype)local_78;
          bVar13 = QtPrivate::equalStrings(QVar29,QVar50);
          bVar13 = bVar13 ^ 1;
        }
        if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_88._0_8_)->d).d =
               *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        if (bVar13 != 0) {
          QString::append((QString *)local_c8);
        }
      }
      local_e8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)local_238,"target.path");
      QMakeEvaluator::first((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_238)
      ;
      ProString::toQString((QString *)local_278,(ProString *)local_88);
      MakefileGenerator::fileFixify
                ((QString *)local_e8,&this->super_MakefileGenerator,(QString *)local_278,
                 (FileFixifyTypes)0x4,true);
      if ((ProString *)local_278._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_278._0_8_)->d).d =
             *(int *)&(((QString *)local_278._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_278._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_278._0_8_,2,0x10);
        }
      }
      if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_88._0_8_)->d).d =
             *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_238._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
        }
      }
      if ((ulong)local_e8._16_8_ < (ProString *)0x2) {
        local_88._0_8_ = local_e8._0_8_;
        stack0xffffffffffffff80 = (ProString *)local_e8._8_8_;
        local_78 = (ProString *)local_e8._16_8_;
        if ((ProString *)local_e8._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_e8._0_8_)->d).d =
               *(int *)&(((QString *)local_e8._0_8_)->d).d + 1;
          UNLOCK();
        }
      }
      else {
        QString::QString((QString *)local_88,(QChar *)(local_e8._8_8_ + local_e8._16_8_ * 2 + -2),1)
        ;
      }
      bVar13 = 1;
      if (local_78 == (ProString *)Option::dir_sep.d.size) {
        QVar30.m_data = (storage_type_conflict *)stack0xffffffffffffff80;
        QVar30.m_size = (qsizetype)local_78;
        QVar51.m_data = Option::dir_sep.d.ptr;
        QVar51.m_size = (qsizetype)local_78;
        bVar13 = QtPrivate::equalStrings(QVar30,QVar51);
        bVar13 = bVar13 ^ 1;
      }
      if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_88._0_8_)->d).d =
             *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      if (bVar13 != 0) {
        QString::append((QString *)local_e8);
      }
      local_108.d = (Data *)0x0;
      local_108.ptr = (ProString *)0x0;
      local_108.size = 0;
      local_128._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_128._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_128._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QVar31.m_data = (storage_type *)0x9;
      QVar31.m_size = (qsizetype)local_88;
      QString::fromUtf8(QVar31);
      local_128._0_8_ = local_88._0_8_;
      local_128._8_8_ = stack0xffffffffffffff80;
      local_128._16_8_ = local_78;
      pQVar1 = (this->super_MakefileGenerator).project;
      local_238._8_8_ = ".targets";
      local_238._0_8_ = t;
      ProString::ProString<QString_const&,char_const(&)[9]>
                ((ProString *)local_88,
                 (QStringBuilder<const_QString_&,_const_char_(&)[9]> *)local_238);
      pPVar17 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_88);
      if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_88._0_8_)->d).d =
             *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)local_88,"QMAKE_BUNDLE");
      bVar11 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
      if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_88._0_8_)->d).d =
             *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      if (bVar11) {
        pQVar1 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)local_238,"TEMPLATE");
        QMakeEvaluator::first
                  ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_238);
        bVar11 = ProString::operator==((ProString *)local_88,"app");
        if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_88._0_8_)->d).d =
               *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_238._0_8_)->d).d =
               *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
          }
        }
        if (bVar11) {
          QVar32.m_size = (size_t)"$(QMAKE_TARGET)";
          QVar32.field_0.m_data = local_128;
          QString::assign(QVar32);
LAB_001adb3a:
          cVar14 = '\0';
        }
        else {
          pQVar1 = (this->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)local_238,"TEMPLATE");
          QMakeEvaluator::first
                    ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_238);
          bVar11 = ProString::operator==((ProString *)local_88,"lib");
          if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_88._0_8_)->d).d =
                 *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            }
          }
          if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_238._0_8_)->d).d =
                 *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
            }
          }
          cVar14 = '\0';
          if (bVar11) {
            pQVar1 = (this->super_MakefileGenerator).project;
            QVar34.m_data = (storage_type *)0x9;
            QVar34.m_size = (qsizetype)local_88;
            QString::fromUtf8(QVar34);
            uVar5 = local_88._0_8_;
            bVar11 = false;
            config_00.m_data = (storage_type_conflict *)stack0xffffffffffffff80;
            config_00.m_size = (qsizetype)local_78;
            bVar15 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_00,false);
            if (!bVar15) {
              pQVar1 = (this->super_MakefileGenerator).project;
              QVar35.m_data = (storage_type *)0x6;
              QVar35.m_size = (qsizetype)local_88;
              QString::fromUtf8(QVar35);
              uVar6 = local_88._0_8_;
              bVar11 = false;
              config_01.m_data = (storage_type_conflict *)stack0xffffffffffffff80;
              config_01.m_size = (qsizetype)local_78;
              bVar15 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_01,false)
              ;
              if (!bVar15) {
                pQVar1 = (this->super_MakefileGenerator).project;
                QString::QString((QString *)local_88,"unversioned_libname");
                config_02.m_data = (storage_type_conflict *)stack0xffffffffffffff80;
                config_02.m_size = (qsizetype)local_78;
                bVar11 = QMakeEvaluator::isActiveConfig
                                   (&pQVar1->super_QMakeEvaluator,config_02,false);
                if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_88._0_8_)->d).d =
                       *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                  }
                }
                bVar11 = !bVar11;
              }
              if ((ProString *)uVar6 != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)uVar6)->d).d = *(int *)&(((QString *)uVar6)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)uVar6)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)uVar6,2,0x10);
                }
              }
            }
            if ((ProString *)uVar5 != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)uVar5)->d).d = *(int *)&(((QString *)uVar5)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)uVar5)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
              }
            }
            cVar14 = '\0';
            if (bVar11) {
              pQVar1 = (this->super_MakefileGenerator).project;
              ProKey::ProKey((ProKey *)local_88,"QMAKE_HPUX_SHLIB");
              bVar11 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
              if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_88._0_8_)->d).d =
                     *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                }
              }
              if (bVar11) {
                ProString::ProString((ProString *)local_88,"$(TARGET0)");
                pPVar18 = ProStringList::operator<<
                                    ((ProStringList *)&local_108,(ProString *)local_88);
                ProString::ProString((ProString *)local_238,"$(TARGET1)");
                pPVar18 = ProStringList::operator<<(pPVar18,(ProString *)local_238);
                ProString::ProString((ProString *)local_278,"$(TARGET2)");
                ProStringList::operator<<(pPVar18,(ProString *)local_278);
                if ((ProString *)local_278._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_278._0_8_)->d).d =
                       *(int *)&(((QString *)local_278._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_278._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_278._0_8_,2,0x10);
                  }
                }
                if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_238._0_8_)->d).d =
                       *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
                  }
                }
              }
              else {
                ProString::ProString((ProString *)local_88,"$(TARGET0)");
                ProStringList::operator<<((ProStringList *)&local_108,(ProString *)local_88);
              }
              if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_88._0_8_)->d).d =
                     *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                }
              }
              goto LAB_001adb3a;
            }
          }
        }
      }
      else {
        pQVar1 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)local_238,"QMAKE_BUNDLE");
        QMakeEvaluator::first
                  ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_238);
        ProString::toQString((QString *)local_278,(ProString *)local_88);
        uVar9 = local_128._8_8_;
        uVar6 = local_128._0_8_;
        pPVar23 = local_268;
        uVar5 = local_278._0_8_;
        local_278._0_8_ = local_128._0_8_;
        local_128._0_8_ = uVar5;
        local_128._8_8_ = local_278._8_8_;
        local_278._8_8_ = uVar9;
        local_268 = (ProString *)local_128._16_8_;
        local_128._16_8_ = pPVar23;
        if ((ProString *)uVar6 != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)uVar6)->d).d = *(int *)&(((QString *)uVar6)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)uVar6)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)uVar6,2,0x10);
          }
        }
        if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_88._0_8_)->d).d =
               *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_238._0_8_)->d).d =
               *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
          }
        }
        pQVar1 = (this->super_MakefileGenerator).project;
        QVar33.m_data = (storage_type *)0xd;
        QVar33.m_size = (qsizetype)local_88;
        QString::fromUtf8(QVar33);
        uVar5 = local_88._0_8_;
        config.m_data = (storage_type_conflict *)stack0xffffffffffffff80;
        config.m_size = (qsizetype)local_78;
        bVar11 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config,false);
        cVar14 = bVar11 + '\x01';
        if ((ProString *)uVar5 != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)uVar5)->d).d = *(int *)&(((QString *)uVar5)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)uVar5)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
          }
        }
      }
      if ((pPVar17->super_QList<ProString>).d.size != 0) {
        lVar24 = 0;
        uVar26 = 0;
        do {
          local_228 = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
          local_238._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_238._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          ProString::toQString
                    ((QString *)local_238,
                     (ProString *)
                     ((long)&(((pPVar17->super_QList<ProString>).d.ptr)->m_string).d.d + lVar24));
          local_268 = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
          local_278._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_278._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QString::QString((QString *)local_88,(QChar)0x2f);
          QString::section(local_148,(QString *)local_238,(QString *)local_88,0xffffffffffffffff,
                           0xffffffffffffffff,0);
          pUVar28 = pUVar52;
          if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_88._0_8_)->d).d =
                 *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
              pUVar28 = pUVar52;
            }
          }
          local_70 = (ProString *)local_148._16_8_;
          local_78 = (ProString *)local_148._8_8_;
          unique0x100082e2 = (ProString *)local_148._0_8_;
          local_88._0_8_ = local_e8;
          local_148._0_8_ = (ProString *)0x0;
          local_148._8_8_ = (ProString *)0x0;
          local_148._16_8_ = (ProString *)0x0;
          QStringBuilder<QString_&,_QString>::convertTo<QString>
                    (&local_2a8.m_string,(QStringBuilder<QString_&,_QString> *)local_88);
          pUVar52 = pUVar28;
          MakefileGenerator::filePrefixRoot
                    ((QString *)local_1d8,&pUVar28->super_MakefileGenerator,
                     (QString *)(local_c8 + 0x20),&local_2a8.m_string);
          (*(pUVar28->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
            [0xc])(local_278,pUVar28,(QStringBuilder<const_char_(&)[14],_QString_&> *)local_1d8);
          if ((ProString *)local_1d8._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_1d8._0_8_)->d).d =
                 *(int *)&(((QString *)local_1d8._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_1d8._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_1d8._0_8_,2,0x10);
            }
          }
          if ((ProString *)local_2a8.m_string.d.d != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_2a8.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (stack0xffffffffffffff80 != (ProString *)0x0) {
            LOCK();
            *(int *)&(stack0xffffffffffffff80->m_string).d.d =
                 *(int *)&(stack0xffffffffffffff80->m_string).d.d + -1;
            UNLOCK();
            if (*(int *)&(stack0xffffffffffffff80->m_string).d.d == 0) {
              QArrayData::deallocate((QArrayData *)stack0xffffffffffffff80,2,0x10);
            }
          }
          if ((ProString *)local_148._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_148._0_8_)->d).d =
                 *(int *)&(((QString *)local_148._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_148._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
            }
          }
          if ((pQVar25->d).size != 0) {
            QString::append(pQVar25,"\n\t",2);
          }
          local_88._0_8_ = local_238._0_8_;
          stack0xffffffffffffff80 = (ProString *)local_238._8_8_;
          local_78 = local_228;
          if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_238._0_8_)->d).d =
                 *(int *)&(((QString *)local_238._0_8_)->d).d + 1;
            UNLOCK();
          }
          string.d.d._7_1_ = cVar12;
          string.d.d._0_7_ = in_stack_fffffffffffffd08;
          string.d.ptr = (char16_t *)pUVar52;
          string.d.size = (qsizetype)pQVar25;
          Option::fixString(&local_2a8.m_string,string,(uchar)local_88);
          if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_88._0_8_)->d).d =
                 *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            }
          }
          (*(pUVar52->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
            [0xc])((QStringBuilder<const_char_(&)[14],_QString_&> *)local_1d8,pUVar52,&local_2a8);
          local_70 = (ProString *)local_1d8._16_8_;
          local_78 = (ProString *)local_1d8._8_8_;
          unique0x1000827a = (ProString *)local_1d8._0_8_;
          local_1d8._16_8_ = (ProString *)0x0;
          local_88._0_8_ = anon_var_dwarf_155e0f;
          local_1d8._0_8_ = (QArrayData *)0x0;
          local_1d8._8_8_ = (ProString *)0x0;
          local_68 = (QString *)CONCAT71(local_68._1_7_,0x20);
          local_60 = (QMakeLocalFileName *)local_278;
          ::operator+=(pQVar25,(QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[13],_QString>,_char>,_QString_&>
                                *)local_88);
          if (stack0xffffffffffffff80 != (ProString *)0x0) {
            LOCK();
            *(int *)&(stack0xffffffffffffff80->m_string).d.d =
                 *(int *)&(stack0xffffffffffffff80->m_string).d.d + -1;
            UNLOCK();
            if (*(int *)&(stack0xffffffffffffff80->m_string).d.d == 0) {
              QArrayData::deallocate((QArrayData *)stack0xffffffffffffff80,2,0x10);
            }
          }
          if ((QArrayData *)local_1d8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_1d8._0_8_,2,0x10);
            }
          }
          if ((ProString *)local_2a8.m_string.d.d != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_2a8.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((this_00->d).size != 0) {
            ProString::ProString((ProString *)local_88,"\n\t");
            QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                      ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,
                       (ProString *)local_88);
            QList<ProString>::end(this_00);
            if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_88._0_8_)->d).d =
                   *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
              }
            }
          }
          local_1d8._0_8_ = "-$(DEL_FILE) ";
          local_1d8._8_8_ = local_278;
          ProString::ProString<char_const(&)[14],QString&>
                    ((ProString *)local_88,
                     (QStringBuilder<const_char_(&)[14],_QString_&> *)local_1d8);
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,(ProString *)local_88)
          ;
          QList<ProString>::end(this_00);
          if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_88._0_8_)->d).d =
                 *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            }
          }
          if ((ProString *)local_278._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_278._0_8_)->d).d =
                 *(int *)&(((QString *)local_278._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_278._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_278._0_8_,2,0x10);
            }
          }
          if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_238._0_8_)->d).d =
                 *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
            }
          }
          uVar26 = uVar26 + 1;
          lVar24 = lVar24 + 0x30;
        } while (uVar26 < (ulong)(pPVar17->super_QList<ProString>).d.size);
      }
      local_148._0_8_ = local_128._0_8_;
      local_148._8_8_ = local_128._8_8_;
      local_148._16_8_ = local_128._16_8_;
      if ((ProString *)local_128._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_128._0_8_)->d).d =
             *(int *)&(((QString *)local_128._0_8_)->d).d + 1;
        UNLOCK();
      }
      pUVar28 = pUVar52;
      if ((undefined1 *)local_c8._16_8_ != (undefined1 *)0x0) {
        local_1d8._0_8_ = local_c8;
        local_1d8._8_8_ = local_128;
        QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                  ((QString *)local_278,(QStringBuilder<QString_&,_QString_&> *)local_1d8);
        local_88._0_8_ = local_278._0_8_;
        stack0xffffffffffffff80 = (ProString *)local_278._8_8_;
        local_78 = local_268;
        if ((ProString *)local_278._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_278._0_8_)->d).d =
               *(int *)&(((QString *)local_278._0_8_)->d).d + 1;
          UNLOCK();
        }
        string_00.d.d._7_1_ = cVar12;
        string_00.d.d._0_7_ = in_stack_fffffffffffffd08;
        string_00.d.ptr = (char16_t *)pUVar28;
        string_00.d.size = (qsizetype)pQVar25;
        Option::fixString((QString *)local_238,string_00,(uchar)local_88);
        if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_88._0_8_)->d).d =
               *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        uVar9 = local_148._8_8_;
        uVar6 = local_148._0_8_;
        pPVar23 = local_228;
        uVar5 = local_238._0_8_;
        local_238._0_8_ = local_148._0_8_;
        local_148._0_8_ = uVar5;
        local_148._8_8_ = local_238._8_8_;
        local_238._8_8_ = uVar9;
        local_228 = (ProString *)local_148._16_8_;
        local_148._16_8_ = pPVar23;
        if ((ProString *)uVar6 != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)uVar6)->d).d = *(int *)&(((QString *)uVar6)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)uVar6)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)uVar6,2,0x10);
          }
        }
        if ((ProString *)local_278._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_278._0_8_)->d).d =
               *(int *)&(((QString *)local_278._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_278._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_278._0_8_,2,0x10);
          }
        }
      }
      local_168._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_278._0_8_ = local_e8;
      local_278._8_8_ = local_128;
      QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                ((QString *)local_238,(QStringBuilder<QString_&,_QString_&> *)local_278);
      MakefileGenerator::fileFixify
                ((QString *)local_88,&pUVar52->super_MakefileGenerator,(QString *)local_238,
                 (FileFixifyTypes)0x4,true);
      MakefileGenerator::filePrefixRoot
                ((QString *)local_168,&pUVar52->super_MakefileGenerator,(QString *)(local_c8 + 0x20)
                 ,(QString *)local_88);
      if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_88._0_8_)->d).d =
             *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      __return_storage_ptr__ = pQVar25;
      if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_238._0_8_)->d).d =
             *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
        }
      }
      local_188._0_8_ = local_168._0_8_;
      local_188._8_8_ = local_168._8_8_;
      local_188._16_8_ = local_168._16_8_;
      if ((ProString *)local_168._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_168._0_8_)->d).d =
             *(int *)&(((QString *)local_168._0_8_)->d).d + 1;
        UNLOCK();
      }
      (*(pUVar28->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                (local_88,pUVar28,local_168);
      pPVar23 = local_78;
      uVar9 = local_88._0_8_;
      uVar6 = local_168._8_8_;
      uVar5 = local_168._0_8_;
      local_88._0_8_ = local_168._0_8_;
      local_168._0_8_ = uVar9;
      local_168._8_8_ = stack0xffffffffffffff80;
      stack0xffffffffffffff80 = (ProString *)uVar6;
      local_78 = (ProString *)local_168._16_8_;
      local_168._16_8_ = pPVar23;
      if ((ProString *)uVar5 != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)uVar5)->d).d = *(int *)&(((QString *)uVar5)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)uVar5)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
        }
      }
      if (cVar14 != '\0') {
        local_2a8.m_string.d.d = (Data *)0x0;
        local_2a8.m_string.d.ptr = (char16_t *)0x0;
        local_2a8.m_string.d.size = 0;
        pQVar1 = (pUVar28->super_MakefileGenerator).project;
        pUVar52 = pUVar28;
        ProKey::ProKey((ProKey *)local_238,"TEMPLATE");
        QMakeEvaluator::first
                  ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_238);
        bVar11 = ProString::operator==((ProString *)local_88,"lib");
        pQVar25 = __return_storage_ptr__;
        if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_88._0_8_)->d).d =
               *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            pQVar25 = __return_storage_ptr__;
          }
        }
        if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_238._0_8_)->d).d =
               *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
          }
        }
        if (bVar11) {
          pQVar1 = (pUVar28->super_MakefileGenerator).project;
          QVar36.m_data = (storage_type *)0xe;
          QVar36.m_size = (qsizetype)local_88;
          QString::fromUtf8(QVar36);
          uVar5 = local_88._0_8_;
          config_03.m_data = (storage_type_conflict *)stack0xffffffffffffff80;
          config_03.m_size = (qsizetype)local_78;
          bVar11 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_03,false);
          pUVar28 = pUVar52;
          if ((ProString *)uVar5 != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)uVar5)->d).d = *(int *)&(((QString *)uVar5)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)uVar5)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
              pUVar28 = pUVar52;
            }
          }
          __return_storage_ptr__ = pQVar25;
          if (!bVar11) {
            pQVar1 = (pUVar28->super_MakefileGenerator).project;
            ProKey::ProKey((ProKey *)local_278,"QMAKE_FRAMEWORK_VERSION");
            QMakeEvaluator::first
                      ((ProString *)local_238,&pQVar1->super_QMakeEvaluator,(ProKey *)local_278);
            local_88._0_8_ = "/Versions/";
            ProString::ProString((ProString *)(local_88 + 8),(ProString *)local_238);
            ::operator+=(&local_2a8.m_string,
                         (QStringBuilder<const_char_(&)[11],_ProString> *)local_88);
            if (stack0xffffffffffffff80 != (ProString *)0x0) {
              LOCK();
              *(int *)&(stack0xffffffffffffff80->m_string).d.d =
                   *(int *)&(stack0xffffffffffffff80->m_string).d.d + -1;
              UNLOCK();
              if (*(int *)&(stack0xffffffffffffff80->m_string).d.d == 0) {
                QArrayData::deallocate((QArrayData *)stack0xffffffffffffff80,2,0x10);
              }
            }
            if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_238._0_8_)->d).d =
                   *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
              }
            }
            __return_storage_ptr__ = pQVar25;
            if ((ProString *)local_278._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_278._0_8_)->d).d =
                   *(int *)&(((QString *)local_278._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_278._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_278._0_8_,2,0x10);
              }
            }
          }
          QString::append(&local_2a8,"/$(TARGET)",10);
        }
        else {
          pQVar1 = (pUVar28->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)local_1d8,"QMAKE_BUNDLE_LOCATION");
          QMakeEvaluator::first
                    ((ProString *)local_278,&pQVar1->super_QMakeEvaluator,(ProKey *)local_1d8);
          local_238._0_8_ = "/";
          ProString::ProString((ProString *)(local_238 + 8),(ProString *)local_278);
          local_88._0_8_ = local_238._0_8_;
          ProString::ProString((ProString *)(local_88 + 8),(ProString *)(local_238 + 8));
          local_50 = (QMakeLocalFileName *)0x2ae5f2;
          QStringBuilder<QStringBuilder<const_char_(&)[2],_ProString>,_const_char_(&)[17]>::
          convertTo<QString>(&local_1a8,
                             (QStringBuilder<QStringBuilder<const_char_(&)[2],_ProString>,_const_char_(&)[17]>
                              *)local_88);
          qVar19 = local_1a8.d.size;
          pDVar8 = local_1a8.d.d;
          pcVar4 = local_2a8.m_string.d.ptr;
          pDVar3 = local_2a8.m_string.d.d;
          local_1a8.d.d = local_2a8.m_string.d.d;
          local_2a8.m_string.d.d = pDVar8;
          local_2a8.m_string.d.ptr = local_1a8.d.ptr;
          local_1a8.d.ptr = pcVar4;
          local_1a8.d.size = local_2a8.m_string.d.size;
          local_2a8.m_string.d.size = qVar19;
          pUVar28 = pUVar52;
          if ((ProString *)pDVar3 != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
              pUVar28 = pUVar52;
            }
          }
          __return_storage_ptr__ = pQVar25;
          if (stack0xffffffffffffff80 != (ProString *)0x0) {
            LOCK();
            *(int *)&(stack0xffffffffffffff80->m_string).d.d =
                 *(int *)&(stack0xffffffffffffff80->m_string).d.d + -1;
            UNLOCK();
            if (*(int *)&(stack0xffffffffffffff80->m_string).d.d == 0) {
              QArrayData::deallocate((QArrayData *)stack0xffffffffffffff80,2,0x10);
            }
          }
          if ((ProString *)local_238._8_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_238._8_8_)->d).d =
                 *(int *)&(((QString *)local_238._8_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_238._8_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_238._8_8_,2,0x10);
            }
          }
          if ((ProString *)local_278._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_278._0_8_)->d).d =
                 *(int *)&(((QString *)local_278._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_278._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_278._0_8_,2,0x10);
            }
          }
          if ((ProString *)local_1d8._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_1d8._0_8_)->d).d =
                 *(int *)&(((QString *)local_1d8._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_1d8._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_1d8._0_8_,2,0x10);
            }
          }
        }
        QString::append((QString *)local_188);
        if (cVar14 == '\x01') {
          if ((pQVar25->d).size != 0) {
            QString::append(pQVar25,"\n\t",2);
          }
          local_88._0_8_ = "$(DEL_FILE) -r ";
          unique0x00005300 = (ProString *)local_168;
          local_78 = (ProString *)0x2af05a;
          ::operator+=(pQVar25,(QStringBuilder<QStringBuilder<const_char_(&)[16],_QString_&>,_const_char_(&)[3]>
                                *)local_88);
        }
        else {
          QString::append((QString *)local_148);
        }
        if ((ProString *)local_2a8.m_string.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_2a8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      (*(pUVar28->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                (local_88,pUVar28,(ProString *)local_148);
      pPVar23 = local_78;
      uVar9 = local_88._0_8_;
      uVar6 = local_148._8_8_;
      uVar5 = local_148._0_8_;
      uVar10 = local_148._12_4_;
      local_88._0_8_ = local_148._0_8_;
      local_148._0_8_ = uVar9;
      local_148._8_8_ = stack0xffffffffffffff80;
      local_88._8_4_ = (undefined4)uVar6;
      uStack_7c = uVar10;
      local_78 = (ProString *)local_148._16_8_;
      local_148._16_8_ = pPVar23;
      if ((ProString *)uVar5 != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)uVar5)->d).d = *(int *)&(((QString *)uVar5)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)uVar5)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
        }
      }
      (*(pUVar28->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                (local_88,pUVar28,local_188);
      pPVar23 = local_78;
      uVar9 = local_88._0_8_;
      uVar6 = local_188._8_8_;
      uVar5 = local_188._0_8_;
      local_88._0_8_ = local_188._0_8_;
      local_188._0_8_ = uVar9;
      local_188._12_4_ = uStack_7c;
      local_188._8_4_ = local_88._8_4_;
      stack0xffffffffffffff80 = (ProString *)uVar6;
      local_78 = (ProString *)local_188._16_8_;
      local_188._16_8_ = pPVar23;
      if ((ProString *)uVar5 != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)uVar5)->d).d = *(int *)&(((QString *)uVar5)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)uVar5)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
        }
      }
      local_1a8.d.d = (Data *)0x0;
      local_1a8.d.ptr = (char16_t *)0x0;
      local_1a8.d.size = 0;
      if (cVar14 == '\x01') {
        local_88._0_8_ = anon_var_dwarf_155e0f;
        local_78 = (ProString *)CONCAT71(local_78._1_7_,0x20);
        local_70 = (ProString *)local_168;
        unique0x1000883a = (ProString *)local_148;
        ::operator+=(&local_1a8,
                     (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[13],_QString_&>,_char>,_QString_&>
                      *)local_88);
      }
      else {
        pQVar1 = (pUVar28->super_MakefileGenerator).project;
        pUVar52 = pUVar28;
        ProKey::ProKey((ProKey *)local_238,"TEMPLATE");
        QMakeEvaluator::first
                  ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_238);
        pQVar25 = __return_storage_ptr__;
        bVar11 = ProString::operator==((ProString *)local_88,"lib");
        if (bVar11) {
          pQVar1 = (pUVar28->super_MakefileGenerator).project;
          QVar37.m_data = (storage_type *)0x9;
          QVar37.m_size = (qsizetype)local_278;
          QString::fromUtf8(QVar37);
          uVar5 = local_278._0_8_;
          config_04.m_data = (storage_type_conflict *)local_278._8_8_;
          config_04.m_size = (qsizetype)local_268;
          bVar11 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_04,false);
          pUVar28 = pUVar52;
          __return_storage_ptr__ = pQVar25;
          if ((ProString *)uVar5 != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)uVar5)->d).d = *(int *)&(((QString *)uVar5)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)uVar5)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
              pUVar28 = pUVar52;
            }
          }
        }
        else {
          bVar11 = false;
          pUVar28 = pUVar52;
          __return_storage_ptr__ = pQVar25;
        }
        if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_88._0_8_)->d).d =
               *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_238._0_8_)->d).d =
               *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
          }
        }
        if (bVar11 == false) {
          if (cVar12 == '\0') {
            if (cVar14 == '\x02') {
              if ((pQVar25->d).size != 0) {
                QString::append(pQVar25,"\n\t",2);
              }
              local_278._0_8_ = anon_var_dwarf_2d2b1c;
              local_278._8_8_ = local_188;
              local_268 = (ProString *)0x2aeeb6;
              QStringBuilder<QStringBuilder<const_char_(&)[11],_QString_&>,_const_char_(&)[3]>::
              convertTo<QString>((QString *)local_238,
                                 (QStringBuilder<QStringBuilder<const_char_(&)[11],_QString_&>,_const_char_(&)[3]>
                                  *)local_278);
              MakefileGenerator::mkdir_p_asstring
                        ((QString *)local_88,&pUVar28->super_MakefileGenerator,(QString *)local_238,
                         false);
              QString::append((QString *)pQVar25);
              pQVar25 = __return_storage_ptr__;
              if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_88._0_8_)->d).d =
                     *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                  pQVar25 = __return_storage_ptr__;
                }
              }
              __return_storage_ptr__ = pQVar25;
              if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_238._0_8_)->d).d =
                     *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
                  __return_storage_ptr__ = pQVar25;
                }
              }
            }
            local_88._0_8_ = "$(QINSTALL_PROGRAM) ";
            local_78 = (ProString *)CONCAT71(local_78._1_7_,0x20);
            local_70 = (ProString *)local_188;
            unique0x1000882a = (ProString *)local_148;
            ::operator+=(&local_1a8,
                         (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[21],_QString_&>,_char>,_QString_&>
                          *)local_88);
          }
        }
        else {
          local_88._0_8_ = anon_var_dwarf_155e0f;
          local_78 = (ProString *)CONCAT71(local_78._1_7_,0x20);
          local_70 = (ProString *)local_188;
          unique0x10008832 = (ProString *)local_148;
          ::operator+=(&local_1a8,
                       (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[13],_QString_&>,_char>,_QString_&>
                        *)local_88);
        }
      }
      pQVar1 = (pUVar28->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)local_238,"TEMPLATE");
      pPVar23 = (ProString *)local_88;
      QMakeEvaluator::first(pPVar23,&pQVar1->super_QMakeEvaluator,(ProKey *)local_238);
      bVar11 = ProString::operator==(pPVar23,"lib");
      pUVar52 = pUVar28;
      if (bVar11) {
        pQVar1 = (pUVar28->super_MakefileGenerator).project;
        QVar38.m_data = (storage_type *)0x9;
        QVar38.m_size = (qsizetype)local_278;
        QString::fromUtf8(QVar38);
        pPVar23 = (ProString *)local_278._0_8_;
        config_05.m_data = (storage_type_conflict *)local_278._8_8_;
        config_05.m_size = (qsizetype)local_268;
        pQVar25 = __return_storage_ptr__;
        bVar15 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_05,false);
        __return_storage_ptr__ = pQVar25;
        if (bVar15) goto LAB_001aef51;
        pQVar1 = (pUVar28->super_MakefileGenerator).project;
        local_1d8._8_8_ = ".CONFIG";
        local_1d8._0_8_ = t;
        ProString::ProString<QString_const&,char_const(&)[8]>
                  ((ProString *)local_278,
                   (QStringBuilder<const_QString_&,_const_char_(&)[8]> *)local_1d8);
        pQVar20 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_278)->
                   super_QList<ProString>;
        qVar19 = QtPrivate::indexOf<ProString,char[10]>(pQVar20,(char (*) [10])"fix_rpath",0);
        bVar15 = qVar19 != -1;
        __return_storage_ptr__ = pQVar25;
        if ((ProString *)local_278._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_278._0_8_)->d).d =
               *(int *)&(((QString *)local_278._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_278._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_278._0_8_,2,0x10);
            __return_storage_ptr__ = pQVar25;
          }
        }
      }
      else {
LAB_001aef51:
        bVar15 = false;
      }
      if (bVar11 && pPVar23 != (ProString *)0x0) {
        LOCK();
        *(int *)&(pPVar23->m_string).d.d = *(int *)&(pPVar23->m_string).d.d + -1;
        UNLOCK();
        if (*(int *)&(pPVar23->m_string).d.d == 0) {
          QArrayData::deallocate((QArrayData *)pPVar23,2,0x10);
        }
      }
      if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_88._0_8_)->d).d =
             *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_238._0_8_)->d).d =
             *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
        }
      }
      if (bVar15) {
        if ((pQVar25->d).size != 0) {
          QString::append(pQVar25,"\n\t",2);
        }
        pQVar1 = (pUVar52->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)local_88,"QMAKE_FIX_RPATH");
        bVar11 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
        if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_88._0_8_)->d).d =
               *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        if (bVar11) {
          pQVar1 = (pUVar52->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)local_88,"QMAKE_LFLAGS_RPATH");
          bVar11 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
          if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_88._0_8_)->d).d =
                 *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            }
          }
          if (bVar11) goto LAB_001af20d;
          ProKey::ProKey((ProKey *)local_238,"QMAKE_LFLAGS_RPATH");
          (*(pUVar52->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
            [0x16])(local_278,pUVar52,(ProKey *)local_238);
          local_70 = local_268;
          local_78 = (ProString *)local_278._8_8_;
          unique0x100081c2 = (ProString *)local_278._0_8_;
          local_268 = (ProString *)0x0;
          local_88._0_8_ = "-$(LINK) $(LFLAGS) ";
          local_278._0_8_ = (ProString *)0x0;
          local_278._8_8_ = (ProString *)0x0;
          local_68 = (QString *)local_e8;
          local_60 = (QMakeLocalFileName *)0x2aecd0;
          local_58 = (QString *)local_188;
          local_50 = (QMakeLocalFileName *)0x2af814;
          ::operator+=(pQVar25,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>,_const_char_(&)[5]>,_QString_&>,_const_char_(&)[31]>
                                *)local_88);
        }
        else {
          QString::append((QString *)pQVar25);
          ProKey::ProKey((ProKey *)local_238,"QMAKE_FIX_RPATH");
          (*(pUVar52->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
            [0x16])(local_278,pUVar52,(ProKey *)local_238);
          local_70 = local_268;
          local_78 = (ProString *)local_278._8_8_;
          unique0x100081ca = (ProString *)local_278._0_8_;
          local_268 = (ProString *)0x0;
          local_88._0_8_ = "\n\t-";
          local_278._0_8_ = (ProString *)0x0;
          local_278._8_8_ = (ProString *)0x0;
          local_68 = (QString *)CONCAT71(local_68._1_7_,0x20);
          local_60 = (QMakeLocalFileName *)local_188;
          local_58 = (QString *)CONCAT71(local_58._1_7_,0x20);
          local_50 = local_60;
          ::operator+=(pQVar25,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char>,_QString_&>,_char>,_QString_&>
                                *)local_88);
        }
        pPVar23 = stack0xffffffffffffff80;
        if (stack0xffffffffffffff80 != (ProString *)0x0) {
          LOCK();
          *(int *)&(stack0xffffffffffffff80->m_string).d.d =
               *(int *)&(stack0xffffffffffffff80->m_string).d.d + -1;
          UNLOCK();
          if (*(int *)&(pPVar23->m_string).d.d == 0) {
            QArrayData::deallocate((QArrayData *)stack0xffffffffffffff80,2,0x10);
          }
        }
        if ((ProString *)local_278._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_278._0_8_)->d).d =
               *(int *)&(((QString *)local_278._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_278._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_278._0_8_,2,0x10);
          }
        }
        if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_238._0_8_)->d).d =
               *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
          }
        }
      }
      else if ((ProString *)local_1a8.d.size != (ProString *)0x0) {
        if ((pQVar25->d).size != 0) {
          QString::append(pQVar25,"\n\t",2);
        }
LAB_001af20d:
        QString::append((QString *)pQVar25);
      }
      pUVar28 = pUVar52;
      if (cVar12 == '\0') {
        pQVar1 = (pUVar52->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)local_238,"TEMPLATE");
        QMakeEvaluator::first
                  ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_238);
        bVar11 = ProString::operator==((ProString *)local_88,"lib");
        if (bVar11) {
          pQVar1 = (pUVar52->super_MakefileGenerator).project;
          QVar39.m_data = (storage_type *)0x9;
          QVar39.m_size = (qsizetype)local_278;
          QString::fromUtf8(QVar39);
          uVar5 = local_278._0_8_;
          config_06.m_data = (storage_type_conflict *)local_278._8_8_;
          config_06.m_size = (qsizetype)local_268;
          bVar11 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_06,false);
          if ((ProString *)uVar5 != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)uVar5)->d).d = *(int *)&(((QString *)uVar5)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)uVar5)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
            }
          }
        }
        else {
          bVar11 = false;
        }
        if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_88._0_8_)->d).d =
               *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_238._0_8_)->d).d =
               *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
          }
        }
        pQVar1 = (pUVar52->super_MakefileGenerator).project;
        if (bVar11 == false) {
          QVar48.m_data = (storage_type *)0xa;
          QVar48.m_size = (qsizetype)local_88;
          QString::fromUtf8(QVar48);
          uVar5 = local_88._0_8_;
          bVar11 = false;
          config_11.m_data = (storage_type_conflict *)stack0xffffffffffffff80;
          config_11.m_size = (qsizetype)local_78;
          bVar15 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_11,false);
          if (!bVar15) {
            pQVar1 = (pUVar52->super_MakefileGenerator).project;
            QVar49.m_data = (storage_type *)0x7;
            QVar49.m_size = (qsizetype)local_88;
            QString::fromUtf8(QVar49);
            uVar6 = local_88._0_8_;
            bVar11 = false;
            config_12.m_data = (storage_type_conflict *)stack0xffffffffffffff80;
            config_12.m_size = (qsizetype)local_78;
            bVar15 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_12,false);
            if (!bVar15) {
              pQVar1 = (pUVar52->super_MakefileGenerator).project;
              ProKey::ProKey((ProKey *)local_88,"QMAKE_STRIP");
              bVar11 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
              if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_88._0_8_)->d).d =
                     *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                }
              }
              bVar11 = !bVar11;
            }
            if ((ProString *)uVar6 != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)uVar6)->d).d = *(int *)&(((QString *)uVar6)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)uVar6)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)uVar6,2,0x10);
              }
            }
          }
          if ((ProString *)uVar5 != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)uVar5)->d).d = *(int *)&(((QString *)uVar5)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)uVar5)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
            }
          }
          if (bVar11) {
            QString::append(__return_storage_ptr__,"\n\t-$(STRIP)",0xb);
            pQVar1 = (pUVar52->super_MakefileGenerator).project;
            ProKey::ProKey((ProKey *)local_238,"TEMPLATE");
            QMakeEvaluator::first
                      ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_238);
            bVar11 = ProString::operator==((ProString *)local_88,"lib");
            pQVar25 = __return_storage_ptr__;
            if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_88._0_8_)->d).d =
                   *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                pQVar25 = __return_storage_ptr__;
              }
            }
            if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_238._0_8_)->d).d =
                   *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
              }
            }
            if (bVar11) {
              pQVar1 = (pUVar52->super_MakefileGenerator).project;
              ProKey::ProKey((ProKey *)local_88,"QMAKE_STRIPFLAGS_LIB");
              bVar11 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
              __return_storage_ptr__ = pQVar25;
              if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_88._0_8_)->d).d =
                     *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                }
              }
              if (!bVar11) {
                str = "QMAKE_STRIPFLAGS_LIB";
LAB_001b1394:
                ProKey::ProKey((ProKey *)local_88,str);
                (*(pUVar52->super_MakefileGenerator).super_QMakeSourceFileInfo.
                  _vptr_QMakeSourceFileInfo[0x16])(local_278,pUVar52,(ProKey *)local_88);
                local_220 = local_268;
                local_228 = (ProString *)local_278._8_8_;
                local_238._8_8_ = local_278._0_8_;
                local_238._0_8_ = " ";
                local_278._0_8_ = (ProString *)0x0;
                local_278._8_8_ = (ProString *)0x0;
                local_268 = (ProString *)0x0;
                ::operator+=(pQVar25,(QStringBuilder<const_char_(&)[2],_QString> *)local_238);
                if ((ProString *)local_238._8_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_238._8_8_)->d).d =
                       *(int *)&(((QString *)local_238._8_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_238._8_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_238._8_8_,2,0x10);
                  }
                }
                if ((ProString *)local_278._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_278._0_8_)->d).d =
                       *(int *)&(((QString *)local_278._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_278._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_278._0_8_,2,0x10);
                  }
                }
                if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_88._0_8_)->d).d =
                       *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                  }
                }
              }
            }
            else {
              pQVar1 = (pUVar52->super_MakefileGenerator).project;
              ProKey::ProKey((ProKey *)local_238,"TEMPLATE");
              QMakeEvaluator::first
                        ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_238);
              bVar11 = ProString::operator==((ProString *)local_88,"app");
              if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_88._0_8_)->d).d =
                     *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                }
              }
              __return_storage_ptr__ = pQVar25;
              if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_238._0_8_)->d).d =
                     *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
                }
              }
              if (bVar11) {
                pQVar1 = (pUVar52->super_MakefileGenerator).project;
                ProKey::ProKey((ProKey *)local_88,"QMAKE_STRIPFLAGS_APP");
                bVar11 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
                if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_88._0_8_)->d).d =
                       *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                  }
                }
                if (!bVar11) {
                  str = "QMAKE_STRIPFLAGS_APP";
                  goto LAB_001b1394;
                }
              }
            }
            local_88[0] = 0x20;
            unique0x00005300 = (ProString *)local_188;
            ::operator+=(pQVar25,(QStringBuilder<char,_QString_&> *)local_88);
          }
        }
        else {
          ProKey::ProKey((ProKey *)local_88,"QMAKE_RANLIB");
          bVar11 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
          pQVar25 = __return_storage_ptr__;
          if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_88._0_8_)->d).d =
                 *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
              pQVar25 = __return_storage_ptr__;
            }
          }
          __return_storage_ptr__ = pQVar25;
          if (!bVar11) {
            QVar47.m_data = &DAT_0000000c;
            QVar47.m_size = (qsizetype)local_88;
            QString::fromUtf8(QVar47);
            local_70 = (ProString *)local_188;
            ::operator+=(pQVar25,(QStringBuilder<QString,_QString_&> *)local_88);
            if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_88._0_8_)->d).d =
                   *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
              }
            }
          }
        }
      }
      if ((this_00->d).size != 0) {
        ProString::ProString((ProString *)local_88,"\n\t");
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                  ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,(ProString *)local_88);
        QList<ProString>::end(this_00);
        if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_88._0_8_)->d).d =
               *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
      }
      if (cVar14 == '\x01') {
        local_238._0_8_ = "-$(DEL_FILE) -r ";
        local_238._8_8_ = local_168;
        ProString::ProString<char_const(&)[17],QString&>
                  ((ProString *)local_88,(QStringBuilder<const_char_(&)[17],_QString_&> *)local_238)
        ;
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                  ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,(ProString *)local_88);
        QList<ProString>::end(this_00);
        if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_88._0_8_)->d).d =
               *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
      }
      else {
        if (cVar12 == '\0') {
          local_238._0_8_ = "-$(DEL_FILE) ";
          local_238._8_8_ = local_188;
          ProString::ProString<char_const(&)[14],QString&>
                    ((ProString *)local_88,
                     (QStringBuilder<const_char_(&)[14],_QString_&> *)local_238);
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,(ProString *)local_88)
          ;
          QList<ProString>::end(this_00);
          if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_88._0_8_)->d).d =
                 *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            }
          }
        }
        if (cVar14 == '\x02') {
          pQVar1 = (pUVar28->super_MakefileGenerator).project;
          pUVar52 = pUVar28;
          ProKey::ProKey((ProKey *)local_238,"DESTDIR");
          QMakeEvaluator::first
                    ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_238);
          iVar16 = local_70._4_4_;
          if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_88._0_8_)->d).d =
                 *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            }
          }
          if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_238._0_8_)->d).d =
                 *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
            }
          }
          pQVar1 = (pUVar28->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)local_88,"QMAKE_BUNDLED_FILES");
          pQVar20 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_88)->
                     super_QList<ProString>;
          if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_88._0_8_)->d).d =
                 *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            }
          }
          this_01 = QList<ProString>::begin(pQVar20);
          iVar21 = QList<ProString>::end(pQVar20);
          pUVar28 = pUVar52;
          for (; this_01.i != iVar21.i; this_01.i = this_01.i + 1) {
            local_1b8 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_1b0 = &DAT_aaaaaaaaaaaaaaaa;
            local_1d8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_1d8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_1d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_1d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            ProString::mid((ProString *)local_1d8,this_01.i,iVar16,-1);
            local_1f8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_1f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_1f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_2a8.m_string.d.d = (Data *)local_e8;
            local_2a8.m_string.d.ptr = (char16_t *)local_1d8;
            QStringBuilder<QString_&,_ProString_&>::convertTo<QString>
                      ((QString *)local_278,(QStringBuilder<QString_&,_ProString_&> *)&local_2a8);
            pUVar52 = pUVar28;
            MakefileGenerator::fileFixify
                      ((QString *)local_238,&pUVar28->super_MakefileGenerator,(QString *)local_278,
                       (FileFixifyTypes)0x4,true);
            MakefileGenerator::filePrefixRoot
                      ((QString *)local_88,&pUVar28->super_MakefileGenerator,
                       (QString *)(local_c8 + 0x20),(QString *)local_238);
            (*(pUVar28->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
              [0xc])(local_1f8,pUVar28,(QStringBuilder<QString,_const_char_(&)[3]> *)local_88);
            if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_88._0_8_)->d).d =
                   *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
              }
            }
            if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_238._0_8_)->d).d =
                   *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
              }
            }
            if ((ProString *)local_278._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_278._0_8_)->d).d =
                   *(int *)&(((QString *)local_278._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_278._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_278._0_8_,2,0x10);
              }
            }
            pQVar25 = __return_storage_ptr__;
            if ((__return_storage_ptr__->d).size != 0) {
              QString::append(__return_storage_ptr__,"\n\t",2);
            }
            local_2a8.m_string.d.d = (Data *)anon_var_dwarf_2d2b1c;
            local_2a8.m_string.d.ptr = (char16_t *)local_1f8;
            local_2a8.m_string.d.size = 0x2aeeb6;
            QStringBuilder<QStringBuilder<const_char_(&)[11],_QString_&>,_const_char_(&)[3]>::
            convertTo<QString>((QString *)local_278,
                               (QStringBuilder<QStringBuilder<const_char_(&)[11],_QString_&>,_const_char_(&)[3]>
                                *)&local_2a8);
            MakefileGenerator::mkdir_p_asstring
                      ((QString *)local_238,&pUVar52->super_MakefileGenerator,(QString *)local_278,
                       false);
            local_78 = local_228;
            unique0x1000823a = (ProString *)local_238._8_8_;
            local_88._0_8_ = local_238._0_8_;
            local_238._0_8_ = (QArrayData *)0x0;
            local_238._8_8_ = (QArrayData *)0x0;
            local_228 = (ProString *)0x0;
            local_70 = (ProString *)0x2af05a;
            ::operator+=(__return_storage_ptr__,
                         (QStringBuilder<QString,_const_char_(&)[3]> *)local_88);
            if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_88._0_8_)->d).d =
                   *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
              }
            }
            if ((QArrayData *)local_238._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
              }
            }
            if ((ProString *)local_278._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_278._0_8_)->d).d =
                   *(int *)&(((QString *)local_278._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_278._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_278._0_8_,2,0x10);
              }
            }
            local_88._0_8_ = "-$(DEL_FILE) ";
            local_78 = (ProString *)0x2af05a;
            __return_storage_ptr__ = pQVar25;
            unique0x10008842 = (ProString *)local_1f8;
            ::operator+=(pQVar25,(QStringBuilder<QStringBuilder<const_char_(&)[14],_QString_&>,_const_char_(&)[3]>
                                  *)local_88);
            MakefileGenerator::escapeFilePath
                      (&local_2a8,&pUVar52->super_MakefileGenerator,this_01.i);
            local_278._0_8_ = anon_var_dwarf_155e0f;
            ProString::ProString((ProString *)(local_278 + 8),&local_2a8);
            local_238._0_8_ = local_278._0_8_;
            ProString::ProString((ProString *)(local_238 + 8),(ProString *)(local_278 + 8));
            local_200 = (QMakeLocalFileName *)0x2b1f52;
            local_88._0_8_ = local_238._0_8_;
            ProString::ProString((ProString *)(local_88 + 8),(ProString *)(local_238 + 8));
            local_50 = local_200;
            local_48 = (ProString *)local_1f8;
            ::operator+=(pQVar25,(QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[13],_ProString>,_const_char_(&)[2]>,_QString_&>
                                  *)local_88);
            pPVar23 = stack0xffffffffffffff80;
            if (stack0xffffffffffffff80 != (ProString *)0x0) {
              LOCK();
              *(int *)&(stack0xffffffffffffff80->m_string).d.d =
                   *(int *)&(stack0xffffffffffffff80->m_string).d.d + -1;
              UNLOCK();
              if (*(int *)&(pPVar23->m_string).d.d == 0) {
                QArrayData::deallocate((QArrayData *)stack0xffffffffffffff80,2,0x10);
              }
            }
            if ((QArrayData *)local_238._8_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_238._8_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_238._8_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_238._8_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_238._8_8_,2,0x10);
              }
            }
            if ((ProString *)local_278._8_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_278._8_8_)->d).d =
                   *(int *)&(((QString *)local_278._8_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_278._8_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_278._8_8_,2,0x10);
              }
            }
            if ((ProString *)local_2a8.m_string.d.d != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d =
                   *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
                QArrayData::deallocate(&(local_2a8.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((this_00->d).size != 0) {
              ProString::ProString((ProString *)local_88,"\n\t");
              QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                        ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,
                         (ProString *)local_88);
              QList<ProString>::end(this_00);
              if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_88._0_8_)->d).d =
                     *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                }
              }
            }
            local_238._0_8_ = "-$(DEL_FILE) ";
            local_238._8_8_ = local_1f8;
            ProString::ProString<char_const(&)[14],QString&>
                      ((ProString *)local_88,
                       (QStringBuilder<const_char_(&)[14],_QString_&> *)local_238);
            QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                      ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,
                       (ProString *)local_88);
            QList<ProString>::end(this_00);
            if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_88._0_8_)->d).d =
                   *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
              }
            }
            if ((ProString *)local_1f8._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_1f8._0_8_)->d).d =
                   *(int *)&(((QString *)local_1f8._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_1f8._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_1f8._0_8_,2,0x10);
              }
            }
            if ((ProString *)local_1d8._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_1d8._0_8_)->d).d =
                   *(int *)&(((QString *)local_1d8._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_1d8._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_1d8._0_8_,2,0x10);
              }
            }
            pUVar28 = pUVar52;
          }
        }
      }
      if (local_108.size != 0) {
        lVar24 = 0;
        uVar27 = 0;
        uVar26 = local_108.size;
        do {
          if ((pUVar28->super_MakefileGenerator).target_mode < TARG_WIN_MODE) {
            local_228 = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
            local_238._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_238._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            pPVar22 = QList<ProString>::data((QList<ProString> *)&local_108);
            local_1d8._8_8_ = (long)&(pPVar22->m_string).d.d + lVar24;
            local_1d8._0_8_ = local_c8;
            QStringBuilder<QString_&,_ProString_&>::convertTo<QString>
                      ((QString *)local_278,(QStringBuilder<QString_&,_ProString_&> *)local_1d8);
            local_88._0_8_ = local_278._0_8_;
            stack0xffffffffffffff80 = (ProString *)local_278._8_8_;
            local_78 = local_268;
            if ((ProString *)local_278._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_278._0_8_)->d).d =
                   *(int *)&(((QString *)local_278._0_8_)->d).d + 1;
              UNLOCK();
            }
            string_01.d.d._7_1_ = cVar12;
            string_01.d.d._0_7_ = in_stack_fffffffffffffd08;
            string_01.d.ptr = (char16_t *)pUVar28;
            string_01.d.size = (qsizetype)__return_storage_ptr__;
            Option::fixString((QString *)local_238,string_01,(uchar)(ProString *)local_88);
            uVar5 = local_88._0_8_;
            pUVar52 = pUVar28;
            if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_88._0_8_)->d).d =
                   *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)uVar5)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                pUVar52 = pUVar28;
              }
            }
            if ((ProString *)local_278._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_278._0_8_)->d).d =
                   *(int *)&(((QString *)local_278._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_278._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_278._0_8_,2,0x10);
              }
            }
            iVar16 = QString::lastIndexOf((QString *)local_238,0x2e5bf0,(CaseSensitivity)local_228);
            if (iVar16 != -1) {
              pPVar23 = (ProString *)((long)local_228 - (long)(iVar16 + 1));
              if (pPVar23 < local_228) {
                QString::QString((QString *)local_88,
                                 (QChar *)((long)&(((QString *)local_238._8_8_)->d).d +
                                          (long)(iVar16 + 1) * 2),(longlong)pPVar23);
              }
              else {
                local_88._0_8_ = local_238._0_8_;
                stack0xffffffffffffff80 = (ProString *)local_238._8_8_;
                local_78 = local_228;
                if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_238._0_8_)->d).d =
                       *(int *)&(((QString *)local_238._0_8_)->d).d + 1;
                  UNLOCK();
                }
              }
              pPVar23 = local_78;
              uVar9 = local_88._0_8_;
              uVar6 = local_238._8_8_;
              uVar5 = local_238._0_8_;
              local_88._0_8_ = local_238._0_8_;
              local_238._0_8_ = uVar9;
              local_238._8_8_ = stack0xffffffffffffff80;
              stack0xffffffffffffff80 = (ProString *)uVar6;
              local_78 = local_228;
              local_228 = pPVar23;
              if ((ProString *)uVar5 != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)uVar5)->d).d = *(int *)&(((QString *)uVar5)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)uVar5)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
                }
              }
            }
            local_268 = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
            local_278._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_278._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_1f8._0_8_ = local_e8;
            local_1f8._8_8_ = (ProString *)local_238;
            QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                      (&local_2a8.m_string,(QStringBuilder<QString_&,_QString_&> *)local_1f8);
            pUVar28 = pUVar52;
            MakefileGenerator::fileFixify
                      ((QString *)local_1d8,&pUVar52->super_MakefileGenerator,&local_2a8.m_string,
                       (FileFixifyTypes)0x4,true);
            MakefileGenerator::filePrefixRoot
                      ((QString *)local_88,&pUVar52->super_MakefileGenerator,
                       (QString *)(local_c8 + 0x20),(QString *)local_1d8);
            (*(pUVar52->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
              [0xc])(local_278,pUVar52,(ProString *)local_88);
            uVar5 = local_88._0_8_;
            if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_88._0_8_)->d).d =
                   *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)uVar5)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
              }
            }
            if ((QArrayData *)local_1d8._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_1d8._0_8_,2,0x10);
              }
            }
            if ((ProString *)local_2a8.m_string.d.d != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d =
                   *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
                QArrayData::deallocate(&(local_2a8.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            local_88._0_8_ = anon_var_dwarf_2d2c18;
            unique0x00005300 = (ProString *)local_278;
            ::operator+=(__return_storage_ptr__,
                         (QStringBuilder<const_char_(&)[25],_QString_&> *)local_88);
            if ((this_00->d).size != 0) {
              ProString::ProString((ProString *)local_88,"\n\t");
              QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                        ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,
                         (ProString *)local_88);
              QList<ProString>::end(this_00);
              if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_88._0_8_)->d).d =
                     *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                }
              }
            }
            local_1d8._0_8_ = "-$(DEL_FILE) ";
            local_1d8._8_8_ = local_278;
            ProString::ProString<char_const(&)[14],QString&>
                      ((ProString *)local_88,
                       (QStringBuilder<const_char_(&)[14],_QString_&> *)local_1d8);
            QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                      ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,
                       (ProString *)local_88);
            QList<ProString>::end(this_00);
            if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_88._0_8_)->d).d =
                   *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
              }
            }
            if ((ProString *)local_278._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_278._0_8_)->d).d =
                   *(int *)&(((QString *)local_278._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_278._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_278._0_8_,2,0x10);
              }
            }
            uVar26 = local_108.size;
            if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_238._0_8_)->d).d =
                   *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
                uVar26 = local_108.size;
              }
            }
          }
          uVar27 = uVar27 + 1;
          lVar24 = lVar24 + 0x30;
        } while (uVar27 < uVar26);
      }
      if ((ProString *)local_1a8.d.d != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_1a8.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_1a8.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_1a8.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
        }
      }
      pUVar52 = pUVar28;
      if ((ProString *)local_188._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_188._0_8_)->d).d =
             *(int *)&(((QString *)local_188._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_188._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_188._0_8_,2,0x10);
        }
      }
      pQVar25 = __return_storage_ptr__;
      if ((ProString *)local_168._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_168._0_8_)->d).d =
             *(int *)&(((QString *)local_168._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_168._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_168._0_8_,2,0x10);
        }
      }
      if ((ProString *)local_148._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_148._0_8_)->d).d =
             *(int *)&(((QString *)local_148._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_148._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
        }
      }
      if (cVar12 == '\0') {
        pQVar1 = (pUVar28->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)local_238,"TEMPLATE");
        QMakeEvaluator::first
                  ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_238);
        bVar11 = ProString::operator==((ProString *)local_88,"lib");
        __return_storage_ptr__ = pQVar25;
        if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_88._0_8_)->d).d =
               *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            __return_storage_ptr__ = pQVar25;
          }
        }
        if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_238._0_8_)->d).d =
               *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
          }
        }
        pQVar25 = __return_storage_ptr__;
        if (bVar11) goto LAB_001b018e;
      }
      else {
LAB_001b018e:
        local_278._0_8_ = (ProString *)0x0;
        local_278._8_8_ = (ProString *)0x0;
        local_268 = (ProString *)0x0;
        QVar40.m_data = (storage_type *)0x3;
        QVar40.m_size = (qsizetype)local_88;
        QString::fromUtf8(QVar40);
        local_238._0_8_ = local_88._0_8_;
        local_238._8_8_ = stack0xffffffffffffff80;
        local_228 = local_78;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)local_278,(qsizetype)local_268,(QString *)local_238)
        ;
        QList<QString>::end((QList<QString> *)local_278);
        QVar41.m_data = (storage_type *)0x7;
        QVar41.m_size = (qsizetype)local_88;
        QString::fromUtf8(QVar41);
        local_1d8._0_8_ = local_88._0_8_;
        local_1d8._8_8_ = stack0xffffffffffffff80;
        local_1d8._16_8_ = local_78;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)local_278,(qsizetype)local_268,(QString *)local_1d8)
        ;
        QList<QString>::end((QList<QString> *)local_278);
        QVar42.m_data = (storage_type *)0x9;
        QVar42.m_size = (qsizetype)local_88;
        QString::fromUtf8(QVar42);
        local_2a8.m_string.d.d = (Data *)local_88._0_8_;
        local_2a8.m_string.d.ptr = (char16_t *)stack0xffffffffffffff80;
        local_2a8.m_string.d.size = (qsizetype)local_78;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)local_278,(qsizetype)local_268,&local_2a8.m_string);
        QList<QString>::end((QList<QString> *)local_278);
        if ((ProString *)local_2a8.m_string.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_2a8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((ProString *)local_1d8._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_1d8._0_8_)->d).d =
               *(int *)&(((QString *)local_1d8._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_1d8._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_1d8._0_8_,2,0x10);
          }
        }
        if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_238._0_8_)->d).d =
               *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
          }
        }
        if (local_268 != (ProString *)0x0) {
          lVar24 = 0x10;
          pPVar23 = (ProString *)0x0;
          do {
            local_1d8._0_8_ = *(undefined8 *)(local_278._8_8_ + lVar24 + -0x10);
            local_1d8._8_8_ = *(undefined8 *)(local_278._8_8_ + lVar24 + -8);
            local_1d8._16_8_ = *(undefined8 *)((long)&(((QString *)local_278._8_8_)->d).d + lVar24);
            if ((ProString *)local_1d8._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((ProString *)local_1d8._0_8_)->m_string).d.d =
                   *(int *)&(((ProString *)local_1d8._0_8_)->m_string).d.d + 1;
              UNLOCK();
            }
            local_2a8.m_string.d.d = (Data *)0x0;
            local_2a8.m_string.d.ptr = (char16_t *)0x0;
            local_2a8.m_string.d.size = 0;
            bVar11 = comparesEqual((QString *)local_1d8,"prl");
            if (bVar11) {
              pQVar1 = (pUVar28->super_MakefileGenerator).project;
              QVar43.m_data = (storage_type *)0xa;
              QVar43.m_size = (qsizetype)local_88;
              QString::fromUtf8(QVar43);
              uVar5 = local_88._0_8_;
              bVar11 = false;
              config_07.m_data = (storage_type_conflict *)stack0xffffffffffffff80;
              config_07.m_size = (qsizetype)local_78;
              bVar15 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_07,false)
              ;
              if (bVar15) {
                pQVar1 = (pUVar28->super_MakefileGenerator).project;
                QVar44.m_data = (storage_type *)0xe;
                QVar44.m_size = (qsizetype)local_88;
                QString::fromUtf8(QVar44);
                uVar6 = local_88._0_8_;
                bVar11 = false;
                config_08.m_data = (storage_type_conflict *)stack0xffffffffffffff80;
                config_08.m_size = (qsizetype)local_78;
                bVar15 = QMakeEvaluator::isActiveConfig
                                   (&pQVar1->super_QMakeEvaluator,config_08,false);
                pUVar28 = pUVar52;
                if (!bVar15) {
                  pQVar1 = (pUVar52->super_MakefileGenerator).project;
                  ProKey::ProKey((ProKey *)local_88,"QMAKE_INTERNAL_PRL_FILE");
                  bVar11 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
                  if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)local_88._0_8_)->d).d =
                         *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                    }
                  }
                  bVar11 = !bVar11;
                  pUVar28 = pUVar52;
                }
                pUVar52 = pUVar28;
                if ((ProString *)uVar6 != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)uVar6)->d).d = *(int *)&(((QString *)uVar6)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)uVar6)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)uVar6,2,0x10);
                  }
                }
              }
              __return_storage_ptr__ = pQVar25;
              if ((ProString *)uVar5 != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)uVar5)->d).d = *(int *)&(((QString *)uVar5)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)uVar5)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
                  __return_storage_ptr__ = pQVar25;
                }
              }
              pQVar25 = __return_storage_ptr__;
              if (bVar11) {
                MakefileGenerator::prlFileName
                          ((QString *)local_88,&pUVar28->super_MakefileGenerator,false);
                pPVar7 = local_78;
                uVar5 = local_88._0_8_;
                pcVar4 = local_2a8.m_string.d.ptr;
                pDVar3 = local_2a8.m_string.d.d;
                local_88._0_8_ = local_2a8.m_string.d.d;
                local_2a8.m_string.d.d = (Data *)uVar5;
                local_2a8.m_string.d.ptr = (char16_t *)stack0xffffffffffffff80;
                stack0xffffffffffffff80 = (ProString *)pcVar4;
                local_78 = (ProString *)local_2a8.m_string.d.size;
                local_2a8.m_string.d.size = (qsizetype)pPVar7;
                if ((ProString *)pDVar3 != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d =
                       *(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d == 0) {
                    QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
                  }
                }
              }
            }
            bVar11 = comparesEqual((QString *)local_1d8,"libtool");
            if (bVar11) {
              pQVar1 = (pUVar28->super_MakefileGenerator).project;
              QVar45.m_data = (storage_type *)0xe;
              QVar45.m_size = (qsizetype)local_88;
              QString::fromUtf8(QVar45);
              uVar5 = local_88._0_8_;
              config_09.m_data = (storage_type_conflict *)stack0xffffffffffffff80;
              config_09.m_size = (qsizetype)local_78;
              bVar11 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_09,false)
              ;
              pUVar28 = pUVar52;
              if ((ProString *)uVar5 != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)uVar5)->d).d = *(int *)&(((QString *)uVar5)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)uVar5)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
                  pUVar28 = pUVar52;
                }
              }
              pUVar52 = pUVar28;
              if (bVar11) {
                libtoolFileName((QString *)local_88,pUVar28,false);
                pPVar7 = local_78;
                uVar5 = local_88._0_8_;
                pcVar4 = local_2a8.m_string.d.ptr;
                pDVar3 = local_2a8.m_string.d.d;
                local_88._0_8_ = local_2a8.m_string.d.d;
                local_2a8.m_string.d.d = (Data *)uVar5;
                local_2a8.m_string.d.ptr = (char16_t *)stack0xffffffffffffff80;
                stack0xffffffffffffff80 = (ProString *)pcVar4;
                local_78 = (ProString *)local_2a8.m_string.d.size;
                local_2a8.m_string.d.size = (qsizetype)pPVar7;
                if ((ProString *)pDVar3 != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d =
                       *(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d == 0) {
                    QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
                  }
                }
              }
            }
            bVar11 = comparesEqual((QString *)local_1d8,"pkgconfig");
            if (bVar11) {
              pQVar1 = (pUVar28->super_MakefileGenerator).project;
              QVar46.m_data = (storage_type *)0x9;
              QVar46.m_size = (qsizetype)local_88;
              QString::fromUtf8(QVar46);
              uVar5 = local_88._0_8_;
              config_10.m_data = (storage_type_conflict *)stack0xffffffffffffff80;
              config_10.m_size = (qsizetype)local_78;
              bVar11 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_10,false)
              ;
              pUVar28 = pUVar52;
              if ((ProString *)uVar5 != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)uVar5)->d).d = *(int *)&(((QString *)uVar5)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)uVar5)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
                  pUVar28 = pUVar52;
                }
              }
              pUVar52 = pUVar28;
              if (bVar11) {
                MakefileGenerator::pkgConfigFileName
                          ((QString *)local_88,&pUVar28->super_MakefileGenerator,false);
                pPVar7 = local_78;
                uVar5 = local_88._0_8_;
                pcVar4 = local_2a8.m_string.d.ptr;
                pDVar3 = local_2a8.m_string.d.d;
                local_88._0_8_ = local_2a8.m_string.d.d;
                local_2a8.m_string.d.d = (Data *)uVar5;
                local_2a8.m_string.d.ptr = (char16_t *)stack0xffffffffffffff80;
                stack0xffffffffffffff80 = (ProString *)pcVar4;
                local_78 = (ProString *)local_2a8.m_string.d.size;
                local_2a8.m_string.d.size = (qsizetype)pPVar7;
                if ((ProString *)pDVar3 != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d =
                       *(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d == 0) {
                    QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
                  }
                }
              }
            }
            if ((ProString *)local_2a8.m_string.d.size != (ProString *)0x0) {
              local_148._0_8_ = local_2a8.m_string.d.d;
              local_148._8_8_ = local_2a8.m_string.d.ptr;
              local_148._16_8_ = local_2a8.m_string.d.size;
              if ((ProString *)local_2a8.m_string.d.d != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d =
                     *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d + 1;
                UNLOCK();
              }
              if ((undefined1 *)local_c8._16_8_ != (undefined1 *)0x0) {
                local_188._0_8_ = local_c8;
                local_188._8_8_ = &local_2a8;
                QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                          ((QString *)local_168,(QStringBuilder<QString_&,_QString_&> *)local_188);
                local_88._0_8_ = local_168._0_8_;
                stack0xffffffffffffff80 = (ProString *)local_168._8_8_;
                local_78 = (ProString *)local_168._16_8_;
                if ((ProString *)local_168._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_168._0_8_)->d).d =
                       *(int *)&(((QString *)local_168._0_8_)->d).d + 1;
                  UNLOCK();
                }
                string_02.d.d._7_1_ = cVar12;
                string_02.d.d._0_7_ = in_stack_fffffffffffffd08;
                string_02.d.ptr = (char16_t *)pUVar52;
                string_02.d.size = (qsizetype)pQVar25;
                Option::fixString((QString *)local_238,string_02,(uchar)local_88);
                if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_88._0_8_)->d).d =
                       *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                  }
                }
                uVar9 = local_148._8_8_;
                uVar6 = local_148._0_8_;
                pPVar7 = local_228;
                uVar5 = local_238._0_8_;
                local_238._0_8_ = local_148._0_8_;
                local_148._0_8_ = uVar5;
                local_148._8_8_ = local_238._8_8_;
                local_238._8_8_ = uVar9;
                local_228 = (ProString *)local_148._16_8_;
                local_148._16_8_ = pPVar7;
                if ((ProString *)uVar6 != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)uVar6)->d).d = *(int *)&(((QString *)uVar6)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)uVar6)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)uVar6,2,0x10);
                  }
                }
                if ((ProString *)local_168._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_168._0_8_)->d).d =
                       *(int *)&(((QString *)local_168._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_168._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_168._0_8_,2,0x10);
                  }
                }
              }
              local_168._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_168._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_168._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_188._0_8_ = local_e8;
              local_188._8_8_ = &local_2a8;
              QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                        ((QString *)local_238,(QStringBuilder<QString_&,_QString_&> *)local_188);
              MakefileGenerator::fileFixify
                        ((QString *)local_88,&pUVar28->super_MakefileGenerator,(QString *)local_238,
                         (FileFixifyTypes)0x4,true);
              MakefileGenerator::filePrefixRoot
                        ((QString *)local_168,&pUVar28->super_MakefileGenerator,
                         (QString *)(local_c8 + 0x20),(QString *)local_88);
              if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_88._0_8_)->d).d =
                     *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                }
              }
              if ((ProString *)local_238._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_238._0_8_)->d).d =
                     *(int *)&(((QString *)local_238._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_238._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
                }
              }
              if ((this_00->d).size != 0) {
                ProString::ProString((ProString *)local_88,"\n\t");
                QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                          ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,
                           (ProString *)local_88);
                QList<ProString>::end(this_00);
                if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_88._0_8_)->d).d =
                       *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                  }
                }
              }
              (*(pUVar28->super_MakefileGenerator).super_QMakeSourceFileInfo.
                _vptr_QMakeSourceFileInfo[0xc])(local_188,pUVar28,local_168);
              local_220 = (ProString *)local_188._16_8_;
              local_228 = (ProString *)local_188._8_8_;
              local_238._8_8_ = local_188._0_8_;
              local_238._0_8_ = "-$(DEL_FILE) ";
              local_188._0_8_ = (QArrayData *)0x0;
              local_188._8_8_ = (QString *)0x0;
              local_188._16_8_ = 0;
              ProString::ProString<char_const(&)[14],QString>
                        ((ProString *)local_88,
                         (QStringBuilder<const_char_(&)[14],_QString> *)local_238);
              QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                        ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,
                         (ProString *)local_88);
              QList<ProString>::end(this_00);
              if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_88._0_8_)->d).d =
                     *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_238._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_238._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_238._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_238._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_238._8_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_188._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_188._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_188._0_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_188._0_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_188._0_8_,2,0x10);
                }
              }
              uVar5 = local_168._0_8_;
              local_188._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_188._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_188._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              if ((ProString *)local_168._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_168._0_8_)->d).d =
                     *(int *)&(((QString *)local_168._0_8_)->d).d + 1;
                UNLOCK();
              }
              file_00.d.d._7_1_ = cVar12;
              file_00.d.d._0_7_ = in_stack_fffffffffffffd08;
              file_00.d.ptr = (char16_t *)pUVar52;
              file_00.d.size = (qsizetype)pQVar25;
              MakefileGenerator::fileInfo((MakefileGenerator *)local_88,file_00);
              QFileInfo::path();
              QFileInfo::~QFileInfo((QFileInfo *)local_88);
              if ((ProString *)uVar5 != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)uVar5)->d).d = *(int *)&(((QString *)uVar5)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)uVar5)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
                }
              }
              if ((ProString *)local_188._16_8_ != (ProString *)0x0) {
                if ((__return_storage_ptr__->d).size != 0) {
                  QString::append(__return_storage_ptr__,"\n\t",2);
                }
                MakefileGenerator::mkdir_p_asstring
                          ((QString *)local_88,&pUVar28->super_MakefileGenerator,
                           (QString *)local_188,true);
                QString::append((QString *)__return_storage_ptr__);
                if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_88._0_8_)->d).d =
                       *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                  }
                }
              }
              if ((__return_storage_ptr__->d).size != 0) {
                QString::append(__return_storage_ptr__,"\n\t",2);
              }
              QString::toUpper_helper((QString *)local_1f8);
              local_220 = (ProString *)local_1f8._16_8_;
              local_228 = (ProString *)local_1f8._8_8_;
              local_238._8_8_ = local_1f8._0_8_;
              local_1f8._16_8_ = (ProString *)0x0;
              local_238._0_8_ = "QMAKE_";
              local_1f8._0_8_ = (ProString *)0x0;
              local_1f8._8_8_ = (ProString *)0x0;
              local_218 = (char (*) [17])0x2acb52;
              ProString::ProString<QStringBuilder<char_const(&)[7],QString>,char_const(&)[17]>
                        ((ProString *)local_88,
                         (QStringBuilder<QStringBuilder<const_char_(&)[7],_QString>,_const_char_(&)[17]>
                          *)local_238);
              MakefileGenerator::installMetaFile
                        (&local_1a8,&pUVar28->super_MakefileGenerator,(ProKey *)local_88,
                         (QString *)local_148,(QString *)local_168);
              QString::append((QString *)__return_storage_ptr__);
              if ((ProString *)local_1a8.d.d != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)&(local_1a8.d.d)->super_QArrayData)->d).d =
                     *(int *)&(((QString *)&(local_1a8.d.d)->super_QArrayData)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)&(local_1a8.d.d)->super_QArrayData)->d).d == 0) {
                  QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_88._0_8_)->d).d =
                     *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                }
              }
              if ((ProString *)local_238._8_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_238._8_8_)->d).d =
                     *(int *)&(((QString *)local_238._8_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_238._8_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_238._8_8_,2,0x10);
                }
              }
              if ((ProString *)local_1f8._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_1f8._0_8_)->d).d =
                     *(int *)&(((QString *)local_1f8._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_1f8._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_1f8._0_8_,2,0x10);
                }
              }
              if ((ProString *)local_188._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_188._0_8_)->d).d =
                     *(int *)&(((QString *)local_188._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_188._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_188._0_8_,2,0x10);
                }
              }
              if ((ProString *)local_168._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_168._0_8_)->d).d =
                     *(int *)&(((QString *)local_168._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_168._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_168._0_8_,2,0x10);
                }
              }
              if ((ProString *)local_148._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_148._0_8_)->d).d =
                     *(int *)&(((QString *)local_148._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_148._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
                }
              }
            }
            if ((ProString *)local_2a8.m_string.d.d != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d =
                   *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
                QArrayData::deallocate(&(local_2a8.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((ProString *)local_1d8._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_1d8._0_8_)->d).d =
                   *(int *)&(((QString *)local_1d8._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_1d8._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_1d8._0_8_,2,0x10);
              }
            }
            pPVar23 = (ProString *)((long)&(pPVar23->m_string).d.d + 1);
            lVar24 = lVar24 + 0x18;
          } while (pPVar23 < local_268);
        }
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_278);
      }
      if ((ProString *)local_128._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_128._0_8_)->d).d =
             *(int *)&(((QString *)local_128._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_128._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
        }
      }
      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_108);
      if ((ProString *)local_e8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_e8._0_8_)->d).d =
             *(int *)&(((QString *)local_e8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_e8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
        }
      }
      if ((ProString *)local_c8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_c8._0_8_)->d).d =
             *(int *)&(((QString *)local_c8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_c8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
        }
      }
      piVar2 = (int *)CONCAT44(uStack_a4,local_c8._32_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_a4,local_c8._32_4_),2,0x10);
        }
      }
      goto LAB_001ad49b;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_001ad49b:
  if (*(char **)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString
UnixMakefileGenerator::defaultInstall(const QString &t)
{
    if(t != "target" || project->first("TEMPLATE") == "subdirs")
        return QString();

    enum { NoBundle, SolidBundle, SlicedBundle } bundle = NoBundle;
    bool isAux = (project->first("TEMPLATE") == "aux");
    const QString root = installRoot();
    ProStringList &uninst = project->values(ProKey(t + ".uninstall"));
    QString ret, destdir = project->first("DESTDIR").toQString();
    if(!destdir.isEmpty() && destdir.right(1) != Option::dir_sep)
        destdir += Option::dir_sep;
    QString targetdir = fileFixify(project->first("target.path").toQString(), FileFixifyAbsolute);
    if(targetdir.right(1) != Option::dir_sep)
        targetdir += Option::dir_sep;

    ProStringList links;
    QString target="$(TARGET)";
    const ProStringList &targets = project->values(ProKey(t + ".targets"));
    if(!project->isEmpty("QMAKE_BUNDLE")) {
        target = project->first("QMAKE_BUNDLE").toQString();
        bundle = project->isActiveConfig("sliced_bundle") ? SlicedBundle : SolidBundle;
    } else if(project->first("TEMPLATE") == "app") {
        target = "$(QMAKE_TARGET)";
    } else if(project->first("TEMPLATE") == "lib") {
            if (!project->isActiveConfig("staticlib")
                    && !project->isActiveConfig("plugin")
                    && !project->isActiveConfig("unversioned_libname")) {
                if(project->isEmpty("QMAKE_HPUX_SHLIB")) {
                    links << "$(TARGET0)" << "$(TARGET1)" << "$(TARGET2)";
                } else {
                    links << "$(TARGET0)";
                }
            }
    }
    for(int i = 0; i < targets.size(); ++i) {
        QString src = targets.at(i).toQString(),
                dst = escapeFilePath(filePrefixRoot(root, targetdir + src.section('/', -1)));
        if(!ret.isEmpty())
            ret += "\n\t";
        ret += "$(QINSTALL) " + escapeFilePath(Option::fixPathToTargetOS(src, false)) + ' ' + dst;
        if(!uninst.isEmpty())
            uninst.append("\n\t");
        uninst.append("-$(DEL_FILE) " + dst);
    }

    {
        QString src_targ = target;
        if(!destdir.isEmpty())
            src_targ = Option::fixPathToTargetOS(destdir + target, false);
        QString plain_targ = filePrefixRoot(root, fileFixify(targetdir + target, FileFixifyAbsolute));
        QString dst_targ = plain_targ;
        plain_targ = escapeFilePath(plain_targ);
        if (bundle != NoBundle) {
            QString suffix;
            if (project->first("TEMPLATE") == "lib") {
                if (!project->isActiveConfig("shallow_bundle"))
                    suffix += "/Versions/" + project->first("QMAKE_FRAMEWORK_VERSION");
                suffix += "/$(TARGET)";
            } else {
                suffix = "/" + project->first("QMAKE_BUNDLE_LOCATION") + "/$(QMAKE_TARGET)";
            }
            dst_targ += suffix;
            if (bundle == SolidBundle) {
                if (!ret.isEmpty())
                    ret += "\n\t";
                ret += "$(DEL_FILE) -r " + plain_targ + "\n\t";
            } else {
                src_targ += suffix;
            }
        }
        src_targ = escapeFilePath(src_targ);
        dst_targ = escapeFilePath(dst_targ);

        QString copy_cmd;
        if (bundle == SolidBundle) {
            copy_cmd += "$(QINSTALL) " + src_targ + ' ' + plain_targ;
        } else if (project->first("TEMPLATE") == "lib" && project->isActiveConfig("staticlib")) {
            copy_cmd += "$(QINSTALL) " + src_targ + ' ' + dst_targ;
        } else if (!isAux) {
            if (bundle == SlicedBundle) {
                if (!ret.isEmpty())
                    ret += "\n\t";
                ret += mkdir_p_asstring("\"`dirname " + dst_targ + "`\"", false);
            }
            copy_cmd += "$(QINSTALL_PROGRAM) " + src_targ + ' ' + dst_targ;
        }
        if(project->first("TEMPLATE") == "lib" && !project->isActiveConfig("staticlib")
           && project->values(ProKey(t + ".CONFIG")).indexOf("fix_rpath") != -1) {
            if (!ret.isEmpty())
                ret += "\n\t";
            if(!project->isEmpty("QMAKE_FIX_RPATH")) {
                ret += copy_cmd;
                ret += "\n\t-" + var("QMAKE_FIX_RPATH") + ' ' + dst_targ + ' ' + dst_targ;
            } else if(!project->isEmpty("QMAKE_LFLAGS_RPATH")) {
                ret += "-$(LINK) $(LFLAGS) " + var("QMAKE_LFLAGS_RPATH") + targetdir + " -o " +
                       dst_targ + " $(OBJECTS) $(LIBS) $(OBJCOMP)";
            } else {
                ret += copy_cmd;
            }
        } else if (!copy_cmd.isEmpty()) {
            if (!ret.isEmpty())
                ret += "\n\t";
            ret += copy_cmd;
        }

        if (isAux) {
        } else if (project->first("TEMPLATE") == "lib" && project->isActiveConfig("staticlib")) {
            if(!project->isEmpty("QMAKE_RANLIB"))
                ret += QString("\n\t$(RANLIB) ") + dst_targ;
        } else if (!project->isActiveConfig("debug_info") && !project->isActiveConfig("nostrip")
                   && !project->isEmpty("QMAKE_STRIP")) {
            ret += "\n\t-$(STRIP)";
            if (project->first("TEMPLATE") == "lib") {
                if (!project->isEmpty("QMAKE_STRIPFLAGS_LIB"))
                    ret += " " + var("QMAKE_STRIPFLAGS_LIB");
            } else if (project->first("TEMPLATE") == "app") {
                if (!project->isEmpty("QMAKE_STRIPFLAGS_APP"))
                    ret += " " + var("QMAKE_STRIPFLAGS_APP");
            }
            ret += ' ' + dst_targ;
        }
        if(!uninst.isEmpty())
            uninst.append("\n\t");
        if (bundle == SolidBundle)
            uninst.append("-$(DEL_FILE) -r " + plain_targ);
        else if (!isAux)
            uninst.append("-$(DEL_FILE) " + dst_targ);
        if (bundle == SlicedBundle) {
            int dstlen = project->first("DESTDIR").length();
            for (const ProString &src : project->values("QMAKE_BUNDLED_FILES")) {
                ProString file = src.mid(dstlen);
                QString dst = escapeFilePath(
                            filePrefixRoot(root, fileFixify(targetdir + file, FileFixifyAbsolute)));
                if (!ret.isEmpty())
                    ret += "\n\t";
                ret += mkdir_p_asstring("\"`dirname " + dst + "`\"", false) + "\n\t";
                ret += "-$(DEL_FILE) " + dst + "\n\t"; // Can't overwrite symlinks to directories
                ret += "$(QINSTALL) " + escapeFilePath(src) + " " + dst;
                if (!uninst.isEmpty())
                    uninst.append("\n\t");
                uninst.append("-$(DEL_FILE) " + dst);
            }
        }
        if(!links.isEmpty()) {
            for(int i = 0; i < links.size(); ++i) {
                if (target_mode == TARG_UNIX_MODE || target_mode == TARG_MAC_MODE) {
                    QString link = Option::fixPathToTargetOS(destdir + links[i], false);
                    int lslash = link.lastIndexOf(Option::dir_sep);
                    if(lslash != -1)
                        link = link.right(link.size() - (lslash + 1));
                    QString dst_link = escapeFilePath(
                                filePrefixRoot(root, fileFixify(targetdir + link, FileFixifyAbsolute)));
                    ret += "\n\t-$(SYMLINK) $(TARGET) " + dst_link;
                    if(!uninst.isEmpty())
                        uninst.append("\n\t");
                    uninst.append("-$(DEL_FILE) " + dst_link);
                }
            }
        }
    }
    if (isAux || project->first("TEMPLATE") == "lib") {
        QStringList types;
        types << "prl" << "libtool" << "pkgconfig";
        for(int i = 0; i < types.size(); ++i) {
            const QString type = types.at(i);
            QString meta;
            if(type == "prl" && project->isActiveConfig("create_prl") && !project->isActiveConfig("no_install_prl") &&
               !project->isEmpty("QMAKE_INTERNAL_PRL_FILE"))
                meta = prlFileName(false);
            if (type == "libtool" && project->isActiveConfig("create_libtool"))
                meta = libtoolFileName(false);
            if(type == "pkgconfig" && project->isActiveConfig("create_pc"))
                meta = pkgConfigFileName(false);
            if(!meta.isEmpty()) {
                QString src_meta = meta;
                if(!destdir.isEmpty())
                    src_meta = Option::fixPathToTargetOS(destdir + meta, false);
                QString dst_meta = filePrefixRoot(root, fileFixify(targetdir + meta, FileFixifyAbsolute));
                if(!uninst.isEmpty())
                    uninst.append("\n\t");
                uninst.append("-$(DEL_FILE) " + escapeFilePath(dst_meta));
                const QString dst_meta_dir = fileInfo(dst_meta).path();
                if(!dst_meta_dir.isEmpty()) {
                    if(!ret.isEmpty())
                        ret += "\n\t";
                    ret += mkdir_p_asstring(dst_meta_dir, true);
                }
                if (!ret.isEmpty())
                    ret += "\n\t";
                ret += installMetaFile(ProKey("QMAKE_" + type.toUpper() + "_INSTALL_REPLACE"), src_meta, dst_meta);
            }
        }
    }
    return ret;
}